

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O2

bool __thiscall ON_Material::IsPhysicallyBased(ON_Material *this)

{
  bool bVar1;
  ON_UserData *pOVar2;
  ON_UUID local_18;
  
  local_18 = ON_ClassId::Uuid(&ON_PhysicallyBasedMaterialUserData::
                               m_ON_PhysicallyBasedMaterialUserData_class_rtti);
  pOVar2 = ON_Object::GetUserData((ON_Object *)this,&local_18);
  if (pOVar2 == (ON_UserData *)0x0) {
    bVar1 = false;
  }
  else {
    bVar1 = ON_4fColor::IsValid((ON_4fColor *)(pOVar2 + 1),(ON_TextLog *)0x0);
  }
  return bVar1;
}

Assistant:

bool ON_Material::IsPhysicallyBased(void) const
{
  //Optimized version
  const auto pUD = static_cast<ON_PhysicallyBasedMaterialUserData*>(GetUserData(ON_CLASS_ID(ON_PhysicallyBasedMaterialUserData)));
  if (nullptr == pUD)
    return false;

  //https://mcneel.myjetbrains.com/youtrack/issue/RH-68577
  return pUD->m_parameters.base_color.IsValid();

  //return nullptr != PhysicallyBased();
}